

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void CChat::ConSayTeam(IResult *pResult,void *pUserData)

{
  long *in_RDI;
  int unaff_retaddr;
  
  (**(code **)(*in_RDI + 0x20))(in_RDI,0);
  Say((CChat *)pUserData,unaff_retaddr,(char *)in_RDI);
  return;
}

Assistant:

void CChat::ConSayTeam(IConsole::IResult *pResult, void *pUserData)
{
	((CChat*)pUserData)->Say(CHAT_TEAM, pResult->GetString(0));
}